

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxout.cpp
# Opt level: O3

void __thiscall soplex::SPxOut::SPxOut(SPxOut *this)

{
  long lVar1;
  
  this->_vptr_SPxOut = (_func_int **)&PTR__SPxOut_006a8c00;
  this->m_verbosity = ERROR;
  this->m_streams = (ostream **)0x0;
  spx_alloc<std::ostream**>(&this->m_streams,6);
  this->m_streams[1] = (ostream *)&std::cerr;
  *this->m_streams = (ostream *)&std::cerr;
  lVar1 = 0;
  do {
    this->m_streams[lVar1 + 2] = (ostream *)&std::cout;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  return;
}

Assistant:

SPxOut::SPxOut()
   : m_verbosity(ERROR)
   , m_streams(nullptr)
{
   spx_alloc(m_streams, INFO3 + 1);
   m_streams = new(m_streams) std::ostream*[INFO3 + 1];
   m_streams[ ERROR ] = m_streams[ WARNING ] = &std::cerr;

   for(int i = DEBUG; i <= INFO3; ++i)
      m_streams[ i ] = &std::cout;
}